

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::XmlReporter::EndSection(XmlReporter *this,string *param_1,Counts *assertions)

{
  int iVar1;
  XmlWriter *this_00;
  ScopedElement scoped;
  ScopedElement local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar1 = this->m_sectionDepth;
  this->m_sectionDepth = iVar1 + -1;
  if (1 < iVar1) {
    this_00 = &this->m_xml;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"OverallResults","");
    local_b8.m_writer = this_00;
    XmlWriter::startElement(this_00,&local_50);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"successes","");
    XmlWriter::writeAttribute<unsigned_long>(local_b8.m_writer,&local_70,&assertions->passed);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"failures","");
    XmlWriter::writeAttribute<unsigned_long>(local_b8.m_writer,&local_90,&assertions->failed);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"expectedFailures","");
    XmlWriter::writeAttribute<unsigned_long>(local_b8.m_writer,&local_b0,&assertions->failedButOk);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    XmlWriter::ScopedElement::~ScopedElement(&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    XmlWriter::endElement(this_00);
  }
  return;
}

Assistant:

virtual void EndSection( const std::string& /*sectionName*/, const Counts& assertions ) {
            if( --m_sectionDepth > 0 ) {
                m_xml.scopedElement( "OverallResults" )
                    .writeAttribute( "successes", assertions.passed )
                    .writeAttribute( "failures", assertions.failed )
                    .writeAttribute( "expectedFailures", assertions.failedButOk );
                m_xml.endElement();
            }
        }